

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O1

void __thiscall
duckdb::CatalogSetSecretStorage::DropSecretByName
          (CatalogSetSecretStorage *this,string *name,OnEntryNotFound on_entry_not_found,
          optional_ptr<duckdb::CatalogTransaction,_true> transaction)

{
  bool bVar1;
  pointer pcVar2;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  pointer pCVar3;
  optional_ptr<duckdb::CatalogEntry,_true> oVar4;
  ulong uVar5;
  long *plVar6;
  InvalidInputException *this_00;
  long *plVar7;
  uint uVar8;
  undefined7 in_register_00000011;
  char *pcVar9;
  string storage_string;
  string persist_string;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 *local_100;
  long local_f8;
  undefined1 local_f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  CatalogTransaction local_80;
  CatalogTransaction local_58;
  
  uVar8 = (uint)CONCAT71(in_register_00000011,on_entry_not_found);
  pCVar3 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     (&this->secrets);
  GetTransactionOrDefault(&local_58,this,transaction);
  transaction_00.context.ptr = local_58.context.ptr;
  transaction_00.db.ptr = local_58.db.ptr;
  transaction_00.transaction.ptr = local_58.transaction.ptr;
  transaction_00.transaction_id = local_58.transaction_id;
  transaction_00.start_time = local_58.start_time;
  oVar4 = CatalogSet::GetEntry(pCVar3,transaction_00,name);
  if ((uVar8 == 0) && (oVar4.ptr == (CatalogEntry *)0x0)) {
    uVar5 = (ulong)(this->super_SecretStorage).persistent;
    pcVar9 = "temporary";
    if (uVar5 != 0) {
      pcVar9 = "persistent";
    }
    local_100 = local_f0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,pcVar9,pcVar9 + uVar5 + 9);
    bVar1 = (this->super_SecretStorage).persistent;
    if (bVar1 == true) {
      ::std::operator+(&local_a0," in secret storage \'",&(this->super_SecretStorage).storage_name);
      plVar6 = (long *)::std::__cxx11::string::append((char *)&local_a0);
      local_160 = (long *)*plVar6;
      plVar7 = plVar6 + 2;
      if (local_160 == plVar7) {
        local_150 = *plVar7;
        lStack_148 = plVar6[3];
        local_160 = &local_150;
      }
      else {
        local_150 = *plVar7;
      }
      local_158 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
    }
    else {
      local_160 = &local_150;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_160,anon_var_dwarf_63b5960 + 9);
    }
    if ((bVar1 != false) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2)) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"Failed to remove non-existent %s secret \'%s\'%s","");
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_e0,local_100,local_100 + local_f8);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,pcVar2,pcVar2 + name->_M_string_length);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,local_160,local_158 + (long)local_160);
    InvalidInputException::
    InvalidInputException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (this_00,&local_c0,&local_e0,&local_120,&local_140);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar3 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     (&this->secrets);
  GetTransactionOrDefault(&local_80,this,transaction);
  transaction_01.context.ptr = local_80.context.ptr;
  transaction_01.db.ptr = local_80.db.ptr;
  transaction_01.transaction.ptr = local_80.transaction.ptr;
  transaction_01.transaction_id = local_80.transaction_id;
  transaction_01.start_time = local_80.start_time;
  CatalogSet::DropEntry(pCVar3,transaction_01,name,true,true);
  (*(this->super_SecretStorage)._vptr_SecretStorage[0xb])(this,name,(ulong)(uVar8 & 0xff));
  return;
}

Assistant:

void CatalogSetSecretStorage::DropSecretByName(const string &name, OnEntryNotFound on_entry_not_found,
                                               optional_ptr<CatalogTransaction> transaction) {
	auto entry = secrets->GetEntry(GetTransactionOrDefault(transaction), name);
	if (!entry && on_entry_not_found == OnEntryNotFound::THROW_EXCEPTION) {
		string persist_string = persistent ? "persistent" : "temporary";
		string storage_string = persistent ? " in secret storage '" + storage_name + "'" : "";
		throw InvalidInputException("Failed to remove non-existent %s secret '%s'%s", persist_string, name,
		                            storage_string);
	}

	secrets->DropEntry(GetTransactionOrDefault(transaction), name, true, true);
	RemoveSecret(name, on_entry_not_found);
}